

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdD3D56TlvUv::adjust_orig_mthd(MthdD3D56TlvUv *this)

{
  uint32_t *puVar1;
  bool bVar2;
  MthdTest *pMVar3;
  
  bVar2 = this->fin;
  if (bVar2 == true) {
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48 && bVar2 == true) {
    pMVar3 = &(this->super_SingleMthdTest).super_MthdTest;
    (pMVar3->super_StateTest).exp.valid[0] = 0;
    (pMVar3->super_StateTest).exp.valid[1] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin)
			insrt(orig.notify, 0, 1, 0);
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
			skip = true;
		}
	}